

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# positional_argument_test.cpp
# Opt level: O2

void testSinglePositionalArgument_NoOtherArguments_ShouldSucceed(void)

{
  __type _Var1;
  reference __lhs;
  reference __rhs;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_aa;
  allocator<char> local_a9;
  Argengine ae;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  ArgumentVector ps;
  string local_68 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ps,"test",(allocator<char> *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>(local_68,"a",&local_a9);
  __l._M_len = 2;
  __l._M_array = (iterator)&ps;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__l,&local_aa);
  juzzlin::Argengine::Argengine(&ae,&local_48,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&ps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  ps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/positional_argument_test/positional_argument_test.cpp:42:38)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/positional_argument_test/positional_argument_test.cpp:42:38)>
             ::_M_manager;
  local_30._M_unused._M_object = (iterator)&ps;
  juzzlin::Argengine::setPositionalArgumentCallback(&ae);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  juzzlin::Argengine::parse();
  __lhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at(&ps,0);
  juzzlin::Argengine::arguments_abi_cxx11_();
  __rhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at(&local_a0,1);
  _Var1 = std::operator==(__lhs,__rhs);
  if (_Var1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ps);
    juzzlin::Argengine::~Argengine(&ae);
    return;
  }
  __assert_fail("ps.at(0) == ae.arguments().at(1)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/positional_argument_test/positional_argument_test.cpp"
                ,0x2e,"void testSinglePositionalArgument_NoOtherArguments_ShouldSucceed()");
}

Assistant:

void testSinglePositionalArgument_NoOtherArguments_ShouldSucceed()
{
    Argengine ae({ "test", "a" });
    Argengine::ArgumentVector ps;
    ae.setPositionalArgumentCallback([&](Argengine::ArgumentVector args) {
        ps = args;
    });
    ae.parse();
    assert(ps.at(0) == ae.arguments().at(1));
}